

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

JSONValue * JSON::Parse(wchar_t *data)

{
  bool bVar1;
  JSONValue *pJVar2;
  JSONValue *value;
  JSONValue *in_stack_00000040;
  wchar_t **in_stack_000003b8;
  wchar_t *local_10;
  JSONValue *local_8;
  
  bVar1 = SkipWhitespace(&local_10);
  if (bVar1) {
    pJVar2 = JSONValue::Parse(in_stack_000003b8);
    if (pJVar2 == (JSONValue *)0x0) {
      local_8 = (JSONValue *)0x0;
    }
    else {
      bVar1 = SkipWhitespace(&local_10);
      local_8 = pJVar2;
      if (bVar1) {
        if (pJVar2 != (JSONValue *)0x0) {
          JSONValue::~JSONValue(in_stack_00000040);
          operator_delete(pJVar2);
        }
        local_8 = (JSONValue *)0x0;
      }
    }
  }
  else {
    local_8 = (JSONValue *)0x0;
  }
  return local_8;
}

Assistant:

JSONValue *JSON::Parse(const wchar_t *data)
{
	// Skip any preceding whitespace, end of data = no JSON = fail
	if (!SkipWhitespace(&data))
		return NULL;

	// We need the start of a value here now...
	JSONValue *value = JSONValue::Parse(&data);
	if (value == NULL)
		return NULL;
	
	// Can be white space now and should be at the end of the string then...
	if (SkipWhitespace(&data))
	{
		delete value;
		return NULL;
	}
	
	// We're now at the end of the string
	return value;
}